

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

BZFILE * BZ2_bzReadOpen(int *bzerror,FILE *f,int verbosity,int small,void *unused,int nUnused)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  FILE *in_RSI;
  int *in_RDI;
  undefined1 *in_R8;
  int in_R9D;
  int ret;
  bzFile *bzf;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  long lVar2;
  int local_2c;
  undefined1 *local_28;
  bz_stream *local_8;
  
  lVar2 = 0;
  if (in_RDI != (int *)0x0) {
    *in_RDI = 0;
  }
  if ((((in_RSI == (FILE *)0x0) ||
       ((((in_ECX != 0 && (in_ECX != 1)) || (in_EDX < 0)) || (4 < in_EDX)))) ||
      ((in_R8 == (undefined1 *)0x0 && (in_R9D != 0)))) ||
     ((in_R8 != (undefined1 *)0x0 && ((in_R9D < 0 || (5000 < in_R9D)))))) {
    if (in_RDI != (int *)0x0) {
      *in_RDI = -2;
    }
    local_8 = (bz_stream *)0x0;
  }
  else {
    iVar1 = ferror(in_RSI);
    if (iVar1 == 0) {
      local_8 = (bz_stream *)malloc(0x13f0);
      if (local_8 == (bz_stream *)0x0) {
        if (in_RDI != (int *)0x0) {
          *in_RDI = -3;
        }
        local_8 = (bz_stream *)0x0;
      }
      else {
        if (in_RDI != (int *)0x0) {
          *in_RDI = 0;
        }
        if (local_8 != (bz_stream *)0x0) {
          *(undefined4 *)&local_8[0x3f].bzalloc = 0;
        }
        *(undefined1 *)((long)&local_8[0x3f].bzalloc + 4) = 0;
        local_8->next_in = (char *)in_RSI;
        *(undefined4 *)&local_8[0x3e].state = 0;
        *(undefined1 *)((long)&local_8[0x3e].state + 4) = 0;
        local_8[0x3f].avail_out = 0;
        local_8[0x3f].total_out_lo32 = 0;
        *(undefined8 *)&local_8[0x3f].total_out_hi32 = 0;
        local_8[0x3f].state = (void *)0x0;
        local_28 = in_R8;
        for (local_2c = in_R9D; 0 < local_2c; local_2c = local_2c + -1) {
          *(undefined1 *)((long)&local_8->avail_in + (long)*(int *)&local_8[0x3e].state) = *local_28
          ;
          *(int *)&local_8[0x3e].state = *(int *)&local_8[0x3e].state + 1;
          local_28 = local_28 + 1;
        }
        iVar1 = BZ2_bzDecompressInit(local_8,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
        if (iVar1 == 0) {
          *(undefined4 *)&local_8[0x3e].bzfree = *(undefined4 *)&local_8[0x3e].state;
          local_8[0x3e].bzalloc = (_func_void_ptr_void_ptr_int_int *)&local_8->avail_in;
          *(undefined1 *)((long)&local_8[0x3f].bzalloc + 4) = 1;
        }
        else {
          if (in_RDI != (int *)0x0) {
            *in_RDI = iVar1;
          }
          if (local_8 != (bz_stream *)0x0) {
            *(int *)&local_8[0x3f].bzalloc = iVar1;
          }
          free(local_8);
          local_8 = (bz_stream *)0x0;
        }
      }
    }
    else {
      if (in_RDI != (int *)0x0) {
        *in_RDI = -6;
      }
      if (lVar2 != 0) {
        *(undefined4 *)(lVar2 + 0x13e8) = 0xfffffffa;
      }
      local_8 = (bz_stream *)0x0;
    }
  }
  return local_8;
}

Assistant:

BZFILE* BZ_API(BZ2_bzReadOpen)
                   ( int*  bzerror,
                     FILE* f,
                     int   verbosity,
                     int   small,
                     void* unused,
                     int   nUnused )
{
   bzFile* bzf = NULL;
   int     ret;

   BZ_SETERR(BZ_OK);

   if (f == NULL ||
       (small != 0 && small != 1) ||
       (verbosity < 0 || verbosity > 4) ||
       (unused == NULL && nUnused != 0) ||
       (unused != NULL && (nUnused < 0 || nUnused > BZ_MAX_UNUSED)))
      { BZ_SETERR(BZ_PARAM_ERROR); return NULL; };

   if (ferror(f))
      { BZ_SETERR(BZ_IO_ERROR); return NULL; };

   bzf = malloc ( sizeof(bzFile) );
   if (bzf == NULL)
      { BZ_SETERR(BZ_MEM_ERROR); return NULL; };

   BZ_SETERR(BZ_OK);

   bzf->initialisedOk = False;
   bzf->handle        = f;
   bzf->bufN          = 0;
   bzf->writing       = False;
   bzf->strm.bzalloc  = NULL;
   bzf->strm.bzfree   = NULL;
   bzf->strm.opaque   = NULL;

   while (nUnused > 0) {
      bzf->buf[bzf->bufN] = *((UChar*)(unused)); bzf->bufN++;
      unused = ((void*)( 1 + ((UChar*)(unused))  ));
      nUnused--;
   }

   ret = BZ2_bzDecompressInit ( &(bzf->strm), verbosity, small );
   if (ret != BZ_OK)
      { BZ_SETERR(ret); free(bzf); return NULL; };

   bzf->strm.avail_in = bzf->bufN;
   bzf->strm.next_in  = bzf->buf;

   bzf->initialisedOk = True;
   return bzf;
}